

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qregularexpression.cpp
# Opt level: O1

qsizetype __thiscall QRegularExpressionMatch::capturedLength(QRegularExpressionMatch *this,int nth)

{
  QRegularExpressionMatchPrivate *pQVar1;
  longlong *plVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = -1;
  lVar3 = -1;
  if ((-1 < nth) && (pQVar1 = (this->d).d.ptr, nth < pQVar1->capturedCount)) {
    plVar2 = (pQVar1->capturedOffsets).d.ptr;
    if (plVar2[(uint)(nth * 2)] != -1) {
      lVar3 = plVar2[(ulong)(uint)(nth * 2) + 1];
    }
  }
  if ((-1 < nth) && (pQVar1 = (this->d).d.ptr, nth < pQVar1->capturedCount)) {
    lVar4 = (pQVar1->capturedOffsets).d.ptr[(uint)(nth * 2)];
  }
  return lVar3 - lVar4;
}

Assistant:

qsizetype QRegularExpressionMatch::capturedLength(int nth) const
{
    // bound checking performed by these two functions
    return capturedEnd(nth) - capturedStart(nth);
}